

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

size_t __thiscall wasm::anon_unknown_0::RecGroupHasher::hash(RecGroupHasher *this,Type type)

{
  pointer pTVar1;
  Exactness EVar2;
  ulong uVar3;
  HeapType type_00;
  size_t sVar4;
  Tuple *pTVar5;
  ulong uVar6;
  const_iterator __begin2;
  pointer pTVar7;
  const_iterator __end2;
  Type local_38;
  Type type_local;
  
  uVar6 = (ulong)(type.id < 7);
  if (type.id < 7) {
    uVar3 = type.id + 0x9e3779b97f4a8c15;
  }
  else {
    uVar3 = (ulong)((uint)type.id & 1);
    uVar6 = uVar3 + 0x9e3779b97f4a7c15 ^ uVar6;
    local_38.id = type.id;
    if (uVar3 == 0) {
      uVar6 = ((ulong)((uint)type.id >> 1 & 1) | 0xa81af155173f23d6) + uVar6 * 0x1000 ^ uVar6;
      EVar2 = wasm::Type::getExactness(&local_38);
      uVar6 = uVar6 * 0x1000 + -0x61c8864680b583eb + (uVar6 >> 4) + (ulong)EVar2 ^ uVar6;
      type_00 = wasm::Type::getHeapType(&local_38);
      sVar4 = hash(this,type_00);
      return (uVar6 >> 4) + uVar6 * 0x1000 + sVar4 + 0x9e3779b97f4a7c15 ^ uVar6;
    }
    pTVar5 = wasm::Type::getTuple(&local_38);
    pTVar7 = (pTVar5->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pTVar1 = (pTVar5->super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar3 = (long)pTVar1 - (long)pTVar7 >> 3;
    for (; pTVar7 != pTVar1; pTVar7 = pTVar7 + 1) {
      sVar4 = hash(this,(Type)pTVar7->id);
      uVar3 = uVar3 ^ uVar3 * 0x1000 + -0x61c8864680b583eb + (uVar3 >> 4) + sVar4;
    }
    uVar3 = uVar6 * 0x1000 + -0x57e50eaae8c0dc2a + uVar3;
  }
  return uVar3 ^ uVar6;
}

Assistant:

size_t RecGroupHasher::hash(Type type) const {
  size_t digest = wasm::hash(type.isBasic());
  if (type.isBasic()) {
    wasm::rehash(digest, type.getID());
    return digest;
  }
  wasm::rehash(digest, type.isTuple());
  if (type.isTuple()) {
    hash_combine(digest, hash(type.getTuple()));
    return digest;
  }
  assert(type.isRef());
  wasm::rehash(digest, type.getNullability());
  wasm::rehash(digest, type.getExactness());
  hash_combine(digest, hash(type.getHeapType()));
  return digest;
}